

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVector<llvm::DWARFDebugLoc::Entry,_2U>::SmallVector
          (SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *this,
          SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *RHS)

{
  bool bVar1;
  SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *RHS_local;
  SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *this_local;
  
  SmallVectorImpl<llvm::DWARFDebugLoc::Entry>::SmallVectorImpl
            (&this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>,2);
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)RHS);
  if (!bVar1) {
    SmallVectorImpl<llvm::DWARFDebugLoc::Entry>::operator=
              (&this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>,
               &RHS->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>);
  }
  return;
}

Assistant:

SmallVector(SmallVector &&RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(::std::move(RHS));
  }